

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O1

InplaceStr GetReferenceTypeName(ExpressionContext *ctx,TypeBase *type)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  InplaceStr IVar5;
  
  uVar4 = (long)(type->name).end - (long)(type->name).begin;
  uVar3 = (int)uVar4 + 5;
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)uVar3);
  IVar5.begin = (char *)CONCAT44(extraout_var,iVar1);
  if ((int)uVar4 != 0) {
    memcpy(IVar5.begin,(type->name).begin,uVar4 & 0xffffffff);
  }
  builtin_strncpy(IVar5.begin + (uVar4 & 0xffffffff)," ref",5);
  sVar2 = strlen(IVar5.begin);
  if (sVar2 + 1 == (ulong)uVar3) {
    IVar5.end = IVar5.begin + sVar2;
    return IVar5;
  }
  __assert_fail("strlen(name) + 1 == nameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0x98,"InplaceStr GetReferenceTypeName(ExpressionContext &, TypeBase *)");
}

Assistant:

InplaceStr GetReferenceTypeName(ExpressionContext &ctx, TypeBase* type)
{
	unsigned typeNameLength = unsigned(type->name.end - type->name.begin);

	unsigned nameLength = typeNameLength + 4 + 1;
	char *name = (char*)ctx.allocator->alloc(nameLength);

	if(typeNameLength)
		memcpy(name, type->name.begin, typeNameLength);

	memcpy(name + typeNameLength, " ref", 5);

	assert(strlen(name) + 1 == nameLength);
	return InplaceStr(name);
}